

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O0

void __thiscall
CRollingBloomFilter::CRollingBloomFilter(CRollingBloomFilter *this,uint nElements,double fpRate)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  CRollingBloomFilter *this_00;
  int in_ESI;
  uint *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  uint32_t nFilterBits;
  uint32_t nMaxElements;
  double logFpRate;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  uint *__new_size;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(in_stack_ffffffffffffff68);
  dVar4 = log(in_XMM0_Qa);
  dVar5 = log(0.5);
  round(dVar4 / dVar5);
  std::min<int>(in_stack_ffffffffffffff70,(int *)in_stack_ffffffffffffff68);
  this_00 = (CRollingBloomFilter *)
            std::max<int>(in_stack_ffffffffffffff70,(int *)in_stack_ffffffffffffff68);
  in_RDI[0xb] = *(uint *)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &this_00->nEntriesPerGeneration)->_M_impl).super__Vector_impl_data.
                          _M_start;
  *in_RDI = in_ESI + 1U >> 1;
  uVar1 = *in_RDI;
  uVar2 = in_RDI[0xb];
  dVar4 = exp(dVar4 / (double)(int)uVar2);
  dVar4 = log(1.0 - dVar4);
  ceil((-(double)(int)uVar2 * (double)(uVar1 * 3)) / dVar4);
  __new_size = in_RDI + 4;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(in_stack_ffffffffffffff68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,(size_type)__new_size)
  ;
  reset(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CRollingBloomFilter::CRollingBloomFilter(const unsigned int nElements, const double fpRate)
{
    double logFpRate = log(fpRate);
    /* The optimal number of hash functions is log(fpRate) / log(0.5), but
     * restrict it to the range 1-50. */
    nHashFuncs = std::max(1, std::min((int)round(logFpRate / log(0.5)), 50));
    /* In this rolling bloom filter, we'll store between 2 and 3 generations of nElements / 2 entries. */
    nEntriesPerGeneration = (nElements + 1) / 2;
    uint32_t nMaxElements = nEntriesPerGeneration * 3;
    /* The maximum fpRate = pow(1.0 - exp(-nHashFuncs * nMaxElements / nFilterBits), nHashFuncs)
     * =>          pow(fpRate, 1.0 / nHashFuncs) = 1.0 - exp(-nHashFuncs * nMaxElements / nFilterBits)
     * =>          1.0 - pow(fpRate, 1.0 / nHashFuncs) = exp(-nHashFuncs * nMaxElements / nFilterBits)
     * =>          log(1.0 - pow(fpRate, 1.0 / nHashFuncs)) = -nHashFuncs * nMaxElements / nFilterBits
     * =>          nFilterBits = -nHashFuncs * nMaxElements / log(1.0 - pow(fpRate, 1.0 / nHashFuncs))
     * =>          nFilterBits = -nHashFuncs * nMaxElements / log(1.0 - exp(logFpRate / nHashFuncs))
     */
    uint32_t nFilterBits = (uint32_t)ceil(-1.0 * nHashFuncs * nMaxElements / log(1.0 - exp(logFpRate / nHashFuncs)));
    data.clear();
    /* For each data element we need to store 2 bits. If both bits are 0, the
     * bit is treated as unset. If the bits are (01), (10), or (11), the bit is
     * treated as set in generation 1, 2, or 3 respectively.
     * These bits are stored in separate integers: position P corresponds to bit
     * (P & 63) of the integers data[(P >> 6) * 2] and data[(P >> 6) * 2 + 1]. */
    data.resize(((nFilterBits + 63) / 64) << 1);
    reset();
}